

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_5f811d::ParameterPack::hasArraySlow(ParameterPack *this,OutputStream *S)

{
  Cache CVar1;
  Node *pNVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (S->CurrentPackMax == 0xffffffff) {
    uVar5 = (this->Data).NumElements;
    S->CurrentPackMax = (uint)uVar5;
    S->CurrentPackIndex = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)S->CurrentPackIndex;
    uVar5 = (this->Data).NumElements;
  }
  if (uVar4 < uVar5) {
    pNVar2 = (this->Data).Elements[uVar4];
    CVar1 = pNVar2->ArrayCache;
    if (CVar1 == Unknown) {
      iVar3 = (*pNVar2->_vptr_Node[1])();
      return SUB41(iVar3,0);
    }
    return CVar1 == Yes;
  }
  return false;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }